

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

void __thiscall cs_impl::fiber::Ordinator::~Ordinator(Ordinator *this)

{
  bool bVar1;
  iterator this_00;
  reference ppRVar2;
  Routine *in_RDI;
  Routine **routine;
  iterator __end2;
  iterator __begin2;
  vector<cs_impl::fiber::Routine_*,_std::allocator<cs_impl::fiber::Routine_*>_> *__range2;
  Routine *in_stack_ffffffffffffffc8;
  __normal_iterator<cs_impl::fiber::Routine_**,_std::vector<cs_impl::fiber::Routine_*,_std::allocator<cs_impl::fiber::Routine_*>_>_>
  local_18 [3];
  
  local_18[0]._M_current =
       (Routine **)
       std::vector<cs_impl::fiber::Routine_*,_std::allocator<cs_impl::fiber::Routine_*>_>::begin
                 ((vector<cs_impl::fiber::Routine_*,_std::allocator<cs_impl::fiber::Routine_*>_> *)
                  in_stack_ffffffffffffffc8);
  this_00 = std::vector<cs_impl::fiber::Routine_*,_std::allocator<cs_impl::fiber::Routine_*>_>::end
                      ((vector<cs_impl::fiber::Routine_*,_std::allocator<cs_impl::fiber::Routine_*>_>
                        *)in_stack_ffffffffffffffc8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<cs_impl::fiber::Routine_**,_std::vector<cs_impl::fiber::Routine_*,_std::allocator<cs_impl::fiber::Routine_*>_>_>
                        *)in_RDI,
                       (__normal_iterator<cs_impl::fiber::Routine_**,_std::vector<cs_impl::fiber::Routine_*,_std::allocator<cs_impl::fiber::Routine_*>_>_>
                        *)in_stack_ffffffffffffffc8);
    if (!bVar1) break;
    ppRVar2 = __gnu_cxx::
              __normal_iterator<cs_impl::fiber::Routine_**,_std::vector<cs_impl::fiber::Routine_*,_std::allocator<cs_impl::fiber::Routine_*>_>_>
              ::operator*(local_18);
    in_stack_ffffffffffffffc8 = *ppRVar2;
    if (in_stack_ffffffffffffffc8 != (Routine *)0x0) {
      Routine::~Routine(in_RDI);
      operator_delete(in_stack_ffffffffffffffc8,0x438);
    }
    __gnu_cxx::
    __normal_iterator<cs_impl::fiber::Routine_**,_std::vector<cs_impl::fiber::Routine_*,_std::allocator<cs_impl::fiber::Routine_*>_>_>
    ::operator++(local_18);
  }
  std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::~list
            ((list<unsigned_int,_std::allocator<unsigned_int>_> *)0x16fb9f);
  std::vector<cs_impl::fiber::Routine_*,_std::allocator<cs_impl::fiber::Routine_*>_>::~vector
            ((vector<cs_impl::fiber::Routine_*,_std::allocator<cs_impl::fiber::Routine_*>_> *)
             this_00._M_current);
  return;
}

Assistant:

inline ~Ordinator()
			{
				for (auto &routine: routines)
					delete routine;
			}